

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O2

void __thiscall ixxx::ansi::basic::test_method(basic *this)

{
  int __fd;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0 [32];
  path local_d0;
  string filename;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,"tmp/basic",(allocator<char> *)local_f0);
  boost::filesystem::path::path((path *)local_f0,"tmp");
  boost::filesystem::create_directory((path *)local_f0);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::string((string *)local_f0,(string *)&filename);
  boost::filesystem::remove(local_f0);
  std::__cxx11::string::~string((string *)local_f0);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x43);
  local_f0[8] = 0;
  local_f0._0_8_ = &PTR__lazy_ostream_00121818;
  local_f0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = "";
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_78 = "";
  std::__cxx11::string::string((string *)&local_d0,(string *)&filename);
  local_f1 = boost::filesystem::exists(&local_d0);
  local_f2 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_f0,&local_80,0x43,1,2,&local_f1,"fs::exists(filename)",&local_f2,"false");
  std::__cxx11::string::~string((string *)&local_d0);
  __fd = posix::open((char *)&filename,0x41,0x1b6);
  posix::close(__fd);
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x46);
  local_f0[8] = 0;
  local_f0._0_8_ = &PTR__lazy_ostream_00121818;
  local_f0._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_88 = "";
  std::__cxx11::string::string((string *)&local_d0,(string *)&filename);
  local_f1 = boost::filesystem::exists(&local_d0);
  local_f2 = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_f0,&local_90,0x46,1,2,&local_f1,"fs::exists(filename)",&local_f2,"true");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( basic )
    {
      string filename("tmp/basic");
      fs::create_directory("tmp");
      fs::remove(filename);
      BOOST_CHECK_EQUAL(fs::exists(filename), false);
      int fd = posix::open(filename, O_CREAT | O_WRONLY, 0666);
      posix::close(fd);
      BOOST_CHECK_EQUAL(fs::exists(filename), true);
    }